

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_U_invmult_inplace_p(m256v *LU,int rank,m256v *X_inout,int *placements)

{
  long in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  int pj;
  int j;
  int pi;
  int i;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_2c;
  undefined4 local_24;
  
  local_38 = in_stack_ffffffffffffffc4;
  for (local_24 = in_ESI + -1; -1 < local_24; local_24 = local_24 + -1) {
    local_2c = local_24;
    if (in_RCX == 0) {
      local_34 = local_24;
    }
    else {
      local_34 = *(int *)(in_RCX + (long)local_24 * 4);
    }
    while (local_2c = local_2c + 1, local_2c < *(int *)(in_RDI + 4)) {
      if (in_RCX == 0) {
        local_38 = local_2c;
      }
      else {
        local_38 = *(int *)(in_RCX + (long)local_2c * 4);
      }
      in_stack_ffffffffffffffb8 = in_RDX;
      m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8);
      m256v_multadd_row((m256v *)CONCAT44(local_38,in_stack_ffffffffffffffc0),
                        (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                        (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x18),
                        (m256v *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    }
    in_stack_ffffffffffffffa8 = in_RDX;
    m256v_get_el((m256v *)CONCAT44(local_34,in_stack_ffffffffffffffb0),(int)((ulong)in_RDX >> 0x20),
                 (int)in_RDX);
    gf256_inv('\0');
    m256v_mult_row((m256v *)CONCAT44(local_38,in_stack_ffffffffffffffc0),
                   (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x18));
    in_stack_ffffffffffffffb4 = local_34;
  }
  return;
}

Assistant:

void MV_GEN_N(_U_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply U^(-1) */
	for (int i = rank - 1; i >= 0; --i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = i + 1; j < LU->n_col; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
			  MV_GEN_N(_get_el)(LU, i, j),
			  X_inout, pi);
		}
		MV_GEN_N(_mult_row)(X_inout, pi,
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}